

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9False(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  uint fVeryVerbose;
  int iVar4;
  uint fVerbose;
  char *pcVar5;
  uint local_40;
  uint local_3c;
  
  local_3c = 0;
  Extra_UtilGetoptReset();
  local_40 = 0;
  fVerbose = 0;
  fVeryVerbose = 0;
LAB_0027e02e:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"STvwh"), iVar4 = globalUtilOptind, iVar1 == 0x77) {
      fVeryVerbose = fVeryVerbose ^ 1;
    }
    if (iVar1 < 0x54) {
      if (iVar1 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          pNew = Gia_ManCheckFalse(pAbc->pGia,local_3c,local_40,fVerbose,fVeryVerbose);
          Abc_FrameUpdateGia(pAbc,pNew);
          return 0;
        }
        pcVar3 = "Abc_CommandAbc9False(): There is no AIG.\n";
        iVar4 = -1;
        goto LAB_0027e1ee;
      }
      if (iVar1 != 0x53) goto LAB_0027e147;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-S\" should be followed by a char string.\n";
LAB_0027e13b:
        Abc_Print(-1,pcVar3);
        goto LAB_0027e147;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_3c = uVar2;
    }
    else {
      if (iVar1 != 0x54) {
        if (iVar1 != 0x76) goto LAB_0027e147;
        fVerbose = fVerbose ^ 1;
        goto LAB_0027e02e;
      }
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-T\" should be followed by a char string.\n";
        goto LAB_0027e13b;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_40 = uVar2;
    }
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar2 < 0) {
LAB_0027e147:
      Abc_Print(-2,"usage: &false [-ST num] [-vwh]\n");
      Abc_Print(-2,"\t         detecting and elimintation false paths\n");
      Abc_Print(-2,"\t-S num : maximum slack to identify false paths [default = %d]\n",
                (ulong)local_3c);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)local_40);
      pcVar5 = "yes";
      pcVar3 = "yes";
      if (fVerbose == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      if (fVeryVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing additional information [default = %s]\n",pcVar5);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar4 = -2;
LAB_0027e1ee:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9False( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManCheckFalse( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose );
    Gia_Man_t * pTemp;
    int nSlackMax = 0;
    int nTimeOut = 0;
    int c, fVerbose = 0;
    int fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "STvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a char string.\n" );
                goto usage;
            }
            nSlackMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSlackMax < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by a char string.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9False(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManCheckFalse( pAbc->pGia, nSlackMax, nTimeOut, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &false [-ST num] [-vwh]\n" );
    Abc_Print( -2, "\t         detecting and elimintation false paths\n" );
    Abc_Print( -2, "\t-S num : maximum slack to identify false paths [default = %d]\n",  nSlackMax );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n",   nTimeOut );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",    fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}